

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.h
# Opt level: O2

QByteArray * operator+=(QByteArray *a,DecodedData<const_QString_&> *b)

{
  long lVar1;
  qsizetype qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char *it;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (a->d).size;
  qVar2 = QConcatenable<QStringEncoder::DecodedData<const_QString_&>_>::size(b);
  QByteArray::reserve(a,lVar1 + qVar2);
  local_28 = QByteArray::data(a);
  local_28 = local_28 + (a->d).size;
  QConcatenable<QStringEncoder::DecodedData<const_QString_&>_>::appendTo(b,&local_28);
  pcVar3 = (a->d).ptr;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = &QByteArray::_empty;
  }
  QByteArray::resize(a,(long)local_28 - (long)pcVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &operator+=(QByteArray &a, const QStringEncoder::DecodedData<T> &b)
{
    qsizetype len = a.size() + QConcatenable<QStringEncoder::DecodedData<T>>::size(b);
    a.reserve(len);
    char *it = a.data() + a.size();
    QConcatenable<QStringEncoder::DecodedData<T>>::appendTo(b, it);
    a.resize(qsizetype(it - a.constData())); //may be smaller than len
    return a;
}